

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void __thiscall
absl::cord_internal::CordzInfo::CordzInfo
          (CordzInfo *this,CordRep *rep,CordzInfo *src,MethodIdentifier method,
          int64_t sampling_stride)

{
  int iVar1;
  MethodIdentifier MVar2;
  size_t sVar3;
  Time TVar4;
  HiRep local_40;
  uint32_t local_38;
  int64_t sampling_stride_local;
  MethodIdentifier method_local;
  CordzInfo *src_local;
  CordRep *rep_local;
  CordzInfo *this_local;
  
  CordzHandle::CordzHandle(&this->super_CordzHandle);
  (this->super_CordzHandle)._vptr_CordzHandle = (_func_int **)&PTR__CordzInfo_00270e80;
  this->list_ = (List *)global_list_;
  std::atomic<absl::cord_internal::CordzInfo_*>::atomic(&this->ci_prev_,(__pointer_type)0x0);
  std::atomic<absl::cord_internal::CordzInfo_*>::atomic(&this->ci_next_,(__pointer_type)0x0);
  Mutex::Mutex(&this->mutex_);
  this->rep_ = rep;
  iVar1 = GetStackTrace(this->stack_,0x40,1);
  this->stack_depth_ = (long)iVar1;
  sVar3 = FillParentStack(src,this->parent_stack_);
  this->parent_stack_depth_ = sVar3;
  this->method_ = method;
  MVar2 = GetParentMethod(src);
  this->parent_method_ = MVar2;
  CordzUpdateTracker::CordzUpdateTracker(&this->update_tracker_);
  TVar4 = Now();
  local_40 = TVar4.rep_.rep_hi_;
  (this->create_time_).rep_.rep_hi_ = local_40;
  local_38 = TVar4.rep_.rep_lo_;
  (this->create_time_).rep_.rep_lo_ = local_38;
  this->sampling_stride_ = sampling_stride;
  CordzUpdateTracker::LossyAdd(&this->update_tracker_,method,1);
  if (src != (CordzInfo *)0x0) {
    CordzUpdateTracker::LossyAdd(&this->update_tracker_,&src->update_tracker_);
  }
  return;
}

Assistant:

CordzInfo::CordzInfo(CordRep* rep, const CordzInfo* src,
                     MethodIdentifier method, int64_t sampling_stride)
    : rep_(rep),
      stack_depth_(
          static_cast<size_t>(absl::GetStackTrace(stack_,
                                                  /*max_depth=*/kMaxStackDepth,
                                                  /*skip_count=*/1))),
      parent_stack_depth_(FillParentStack(src, parent_stack_)),
      method_(method),
      parent_method_(GetParentMethod(src)),
      create_time_(absl::Now()),
      sampling_stride_(sampling_stride) {
  update_tracker_.LossyAdd(method);
  if (src) {
    // Copy parent counters.
    update_tracker_.LossyAdd(src->update_tracker_);
  }
}